

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O1

SRes SZIP_ISeekInStream_Read(void *p,void *buf,size_t *size)

{
  size_t sVar1;
  size_t sVar2;
  
  if (*size == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (**(code **)(*(long *)((long)p + 0x10) + 0x10))();
  }
  sVar2 = 0;
  if (0 < (long)sVar1) {
    sVar2 = sVar1;
  }
  *size = sVar2;
  return (uint)(sVar1 >> 0x3c) & 0xfffffff8;
}

Assistant:

static SRes SZIP_ISeekInStream_Read(void *p, void *buf, size_t *size)
{
    SZIPLookToRead *stream = (SZIPLookToRead *) p;
    PHYSFS_Io *io = stream->io;
    const PHYSFS_uint64 len = (PHYSFS_uint64) *size;
    const PHYSFS_sint64 rc = (len == 0) ? 0 : io->read(io, buf, len);

    if (rc < 0)
    {
        *size = 0;
        return SZ_ERROR_READ;
    } /* if */

    *size = (size_t) rc;
    return SZ_OK;
}